

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_initDDict_internal
                 (ZSTD_DDict *ddict,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_customMem customMem;
  uint uVar1;
  void *__dest;
  int in_ECX;
  size_t in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  size_t errcod;
  void *internalBuffer;
  undefined8 in_stack_ffffffffffffffb0;
  ZSTD_dictContentType_e dictContentType_00;
  ZSTD_DDict *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  size_t local_8;
  
  dictContentType_00 = (ZSTD_dictContentType_e)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if (((in_ECX == 1) || (in_RSI == (void *)0x0)) || (in_RDX == 0)) {
    *in_RDI = 0;
    in_RDI[1] = in_RSI;
  }
  else {
    dictContentType_00 = (ZSTD_dictContentType_e)((ulong)in_RDI[0xe0a] >> 0x20);
    in_stack_ffffffffffffffb8 = (ZSTD_DDict *)in_RDI[0xe0b];
    customMem.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffffc8;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffc0;
    customMem.opaque = in_stack_ffffffffffffffd0;
    __dest = ZSTD_malloc(in_RDI[0xe09],customMem);
    *in_RDI = __dest;
    in_RDI[1] = __dest;
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    memcpy(__dest,in_RSI,in_RDX);
  }
  in_RDI[2] = in_RDX;
  *(undefined4 *)(in_RDI + 0x506) = 0xc00000c;
  local_8 = ZSTD_loadEntropy_inDDict(in_stack_ffffffffffffffb8,dictContentType_00);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_initDDict_internal(ZSTD_DDict* ddict,
                                      const void* dict, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType)
{
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dict) || (!dictSize)) {
        ddict->dictBuffer = NULL;
        ddict->dictContent = dict;
    } else {
        void* const internalBuffer = ZSTD_malloc(dictSize, ddict->cMem);
        ddict->dictBuffer = internalBuffer;
        ddict->dictContent = internalBuffer;
        if (!internalBuffer) return ERROR(memory_allocation);
        memcpy(internalBuffer, dict, dictSize);
    }
    ddict->dictSize = dictSize;
    ddict->entropy.hufTable[0] = (HUF_DTable)((HufLog)*0x1000001);  /* cover both little and big endian */

    /* parse dictionary content */
    CHECK_F( ZSTD_loadEntropy_inDDict(ddict, dictContentType) );

    return 0;
}